

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::GenerateMaterials(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  aiMaterial *this_00;
  aiMaterial **ppaVar1;
  aiColor4D local_438;
  aiString s;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  s.length = 0;
  s.data[0] = '\0';
  memset(s.data + 1,0x1b,0x3ff);
  aiString::Set(&s,"DefaultMaterial");
  aiMaterial::AddProperty(this_00,&s,"?mat.name",0,0);
  local_438._0_8_ = 0x3f6666663f666666;
  local_438.b = 0.9;
  local_438.a = 1.0;
  aiMaterial::AddProperty(this_00,&local_438,1,"$clr.diffuse",0,0);
  local_438.r = 1.0;
  local_438.g = 1.0;
  local_438.b = 1.0;
  local_438.a = 1.0;
  aiMaterial::AddProperty(this_00,&local_438,1,"$clr.specular",0,0);
  local_438.r = 0.05;
  local_438.g = 0.05;
  local_438.b = 0.05;
  local_438.a = 1.0;
  aiMaterial::AddProperty(this_00,&local_438,1,"$clr.ambient",0,0);
  pScene->mNumMaterials = 1;
  ppaVar1 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar1;
  *ppaVar1 = this_00;
  return;
}

Assistant:

void DXFImporter::GenerateMaterials(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate an almost-white default material. Reason:
    // the default vertex color is GREY, so we are
    // already at Assimp's usual default color.
    // generate a default material
    aiMaterial* pcMat = new aiMaterial();
    aiString s;
    s.Set(AI_DEFAULT_MATERIAL_NAME);
    pcMat->AddProperty(&s, AI_MATKEY_NAME);

    aiColor4D clrDiffuse(0.9f,0.9f,0.9f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_DIFFUSE);

    clrDiffuse = aiColor4D(1.0f,1.0f,1.0f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_SPECULAR);

    clrDiffuse = aiColor4D(0.05f,0.05f,0.05f,1.0f);
    pcMat->AddProperty(&clrDiffuse,1,AI_MATKEY_COLOR_AMBIENT);

    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;
}